

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey_tweak(void)

{
  secp256k1_context *psVar1;
  int iVar2;
  int iVar3;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  secp256k1_scalar scalar_tweak;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  int i;
  uchar tweak [32];
  int pk_parity;
  secp256k1_pubkey output_pk;
  secp256k1_xonly_pubkey internal_xonly_pk;
  secp256k1_pubkey internal_pk;
  uchar sk [32];
  uchar overflows [32];
  uchar zeros64 [64];
  secp256k1_scalar *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  secp256k1_scalar *in_stack_fffffffffffffe08;
  _func_void_char_ptr_void_ptr *p_Var4;
  secp256k1_scalar *in_stack_fffffffffffffe10;
  void *pvVar5;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar6;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe58;
  secp256k1_xonly_pubkey *internal_pubkey;
  secp256k1_pubkey *in_stack_fffffffffffffe60;
  secp256k1_pubkey *output_pubkey;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  uchar *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int iVar7;
  undefined4 in_stack_fffffffffffffe84;
  secp256k1_context *in_stack_fffffffffffffe88;
  undefined1 local_148 [64];
  undefined1 local_108 [160];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  memset(local_48,0,0x40);
  memset(local_68,0xff,0x20);
  testrand256((uchar *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  testrand256((uchar *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  iVar2 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffe88,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x9d,"test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1");
    abort();
  }
  iVar2 = secp256k1_xonly_pubkey_from_pubkey
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffe60,
                     (int *)in_stack_fffffffffffffe58,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x9e,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa0,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa1,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa2,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar7 = 0;
  p_Var4 = (CTX->illegal_callback).fn;
  pvVar5 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x14e777);
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa3,
            "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, ((void*)0), &internal_xonly_pk, tweak)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = p_Var4;
  (psVar1->illegal_callback).data = pvVar5;
  if (iVar7 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa3,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar7 = 0;
  internal_pubkey = (secp256k1_xonly_pubkey *)(CTX->illegal_callback).fn;
  output_pubkey = (secp256k1_pubkey *)(CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x14e893);
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),output_pubkey,
                     internal_pubkey,
                     (uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa4,
            "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, ((void*)0), tweak)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)internal_pubkey;
  (psVar1->illegal_callback).data = output_pubkey;
  if (iVar7 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa4,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_148,local_48,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa6,
            "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
           );
    abort();
  }
  iVar6 = 0;
  p_Var4 = (CTX->illegal_callback).fn;
  pvVar5 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x14ea0e);
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),output_pubkey,
                     internal_pubkey,(uchar *)CONCAT44(iVar6,in_stack_fffffffffffffe50));
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa7,
            "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, ((void*)0))) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = p_Var4;
  (psVar1->illegal_callback).data = pvVar5;
  if (iVar6 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa7,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_148,local_48,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xa9,
            "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),output_pubkey,
                     internal_pubkey,(uchar *)CONCAT44(iVar6,in_stack_fffffffffffffe50));
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xac,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_148,local_48,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xad,
            "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_xonly_pubkey_tweak_add
                    ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),output_pubkey,
                     internal_pubkey,(uchar *)CONCAT44(iVar6,in_stack_fffffffffffffe50));
  if (iVar2 == 1) {
    iVar2 = 0;
    while( true ) {
      if (COUNT <= iVar2) {
        memset(local_108,0,0x40);
        testrand256((uchar *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        p_Var4 = (CTX->illegal_callback).fn;
        pvVar5 = (CTX->illegal_callback).data;
        secp256k1_context_set_illegal_callback
                  ((secp256k1_context *)
                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                   (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x14ee61);
        iVar2 = secp256k1_xonly_pubkey_tweak_add
                          ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),
                           output_pubkey,internal_pubkey,
                           (uchar *)CONCAT44(iVar6,in_stack_fffffffffffffe50));
        psVar1 = CTX;
        if (iVar2 == 0) {
          (CTX->illegal_callback).fn = p_Var4;
          (psVar1->illegal_callback).data = pvVar5;
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                  ,0xc2,"test condition failed: _calls_to_callback == 1");
          abort();
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                ,0xc2,
                "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak)) == 0"
               );
        abort();
      }
      secp256k1_scalar_set_b32
                (in_stack_fffffffffffffe10,(uchar *)in_stack_fffffffffffffe08,
                 (int *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      secp256k1_scalar_negate(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      secp256k1_scalar_get_b32
                ((uchar *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
      iVar3 = secp256k1_xonly_pubkey_tweak_add
                        ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),
                         output_pubkey,internal_pubkey,
                         (uchar *)CONCAT44(iVar6,in_stack_fffffffffffffe50));
      in_stack_fffffffffffffe07 = true;
      if (iVar3 != 0) {
        iVar3 = secp256k1_xonly_pubkey_tweak_add
                          ((secp256k1_context *)CONCAT44(iVar7,in_stack_fffffffffffffe68),
                           output_pubkey,internal_pubkey,
                           (uchar *)CONCAT44(iVar6,in_stack_fffffffffffffe50));
        in_stack_fffffffffffffe07 = iVar3 == 0;
      }
      if (((in_stack_fffffffffffffe07 ^ 0xff) & 1) != 0) break;
      iVar3 = secp256k1_memcmp_var(local_148,local_48,0x40);
      if (iVar3 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                ,0xbc,
                "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
               );
        abort();
      }
      iVar2 = iVar2 + 1;
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xbb,
            "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, sk) == 0) || (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 0)"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
          ,0xb0,
          "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, zeros64) == 1"
         );
  abort();
}

Assistant:

static void test_xonly_pubkey_tweak(void) {
    unsigned char zeros64[64] = { 0 };
    unsigned char overflows[32];
    unsigned char sk[32];
    secp256k1_pubkey internal_pk;
    secp256k1_xonly_pubkey internal_xonly_pk;
    secp256k1_pubkey output_pk;
    int pk_parity;
    unsigned char tweak[32];
    int i;

    memset(overflows, 0xff, sizeof(overflows));
    testrand256(tweak);
    testrand256(sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1);

    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add(CTX, NULL, &internal_xonly_pk, tweak));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, NULL, tweak));
    /* NULL internal_xonly_pk zeroes the output_pk */
    CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, NULL));
    /* NULL tweak zeroes the output_pk */
    CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0);

    /* Invalid tweak zeroes the output_pk */
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0);
    CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk))  == 0);

    /* A zero tweak is fine */
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, zeros64) == 1);

    /* Fails if the resulting key was infinity */
    for (i = 0; i < COUNT; i++) {
        secp256k1_scalar scalar_tweak;
        /* Because sk may be negated before adding, we need to try with tweak =
         * sk as well as tweak = -sk. */
        secp256k1_scalar_set_b32(&scalar_tweak, sk, NULL);
        secp256k1_scalar_negate(&scalar_tweak, &scalar_tweak);
        secp256k1_scalar_get_b32(tweak, &scalar_tweak);
        CHECK((secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, sk) == 0)
              || (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 0));
        CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0);
    }

    /* Invalid pk with a valid tweak */
    memset(&internal_xonly_pk, 0, sizeof(internal_xonly_pk));
    testrand256(tweak);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak));
    CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk))  == 0);
}